

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O1

void __thiscall gvr::Mesh::saveSTL(Mesh *this,char *name)

{
  float fVar1;
  float *pfVar2;
  double dVar3;
  int i;
  long lVar4;
  char cVar5;
  int iVar6;
  uint *puVar7;
  float ret_3;
  float fVar8;
  SVector<float,_3> ret_2;
  Vector3d n;
  SVector<float,_3> ret_1;
  SVector<float,_3> ret;
  Vector6d pose;
  ofstream out;
  ostringstream header;
  undefined8 local_448;
  float local_440;
  undefined1 local_438 [8];
  double dStack_430;
  double local_428 [2];
  undefined8 local_418;
  float local_410;
  undefined8 local_408;
  float local_400;
  float local_3f8 [4];
  float local_3e8 [4];
  undefined1 local_3d8 [40];
  double local_3b0;
  long local_3a0;
  filebuf local_398 [20];
  undefined4 auStack_384 [55];
  ios_base local_2a8 [264];
  long local_1a0;
  undefined8 local_198 [13];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_3a0);
  lVar4 = *(long *)(local_3a0 + -0x18);
  *(undefined4 *)((long)auStack_384 + lVar4) = 5;
  std::ios::clear((int)&local_448 + (int)lVar4 + 0xa8);
  std::ofstream::open((char *)&local_3a0,(_Ios_Openmode)name);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"campose=",8);
  local_438 = (undefined1  [8])0x0;
  dStack_430 = 0.0;
  local_428[0] = 0.0;
  dVar3 = gmath::recoverAngleAxis(&(this->super_PointCloud).super_Model.Rc,(Vector3d *)local_438);
  local_3d8._16_8_ = (this->super_PointCloud).super_Model.Tc.v[2];
  local_3d8._0_8_ = (this->super_PointCloud).super_Model.Tc.v[0];
  local_3d8._8_8_ = (this->super_PointCloud).super_Model.Tc.v[1];
  local_3d8._24_16_ = ZEXT816(0);
  local_3b0 = 0.0;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    local_3d8._32_4_ = SUB84(dVar3 * dStack_430,0);
    local_3d8._24_8_ = dVar3 * (double)local_438;
    local_3d8._36_4_ = (int)((ulong)(dVar3 * dStack_430) >> 0x20);
    local_3b0 = dVar3 * local_428[0];
  }
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 5;
  gmath::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&local_1a0,
                    (SVector<double,_6> *)local_3d8);
  while( true ) {
    lVar4 = std::ostream::tellp();
    if (0x4f < lVar4) break;
    local_438[0] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,local_438,1);
  }
  std::__cxx11::stringbuf::str();
  std::ostream::write((char *)&local_3a0,(long)local_438);
  if (local_438 != (undefined1  [8])local_428) {
    operator_delete((void *)local_438);
  }
  std::ostream::put((char)&local_3a0);
  std::ostream::put((char)&local_3a0);
  std::ostream::put((char)&local_3a0);
  std::ostream::put((char)&local_3a0);
  if (0 < this->n) {
    puVar7 = this->triangle;
    iVar6 = 0;
    do {
      pfVar2 = (this->super_PointCloud).vertex;
      local_438 = (undefined1  [8])*(double **)(pfVar2 + (long)(int)*puVar7 * 3);
      dStack_430 = (double)CONCAT44(dStack_430._4_4_,pfVar2[(long)(int)*puVar7 * 3 + 2]);
      local_408 = *(undefined8 *)(pfVar2 + (long)(int)puVar7[1] * 3);
      local_400 = pfVar2[(long)(int)puVar7[1] * 3 + 2];
      local_418 = *(undefined8 *)(pfVar2 + (long)(int)puVar7[2] * 3);
      local_410 = pfVar2[(long)(int)puVar7[2] * 3 + 2];
      local_3e8[2] = 0.0;
      local_3e8[0] = 0.0;
      local_3e8[1] = 0.0;
      lVar4 = 0;
      do {
        local_3e8[lVar4] =
             *(float *)((long)&local_408 + lVar4 * 4) - *(float *)(local_438 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_3f8[2] = 0.0;
      local_3f8[0] = 0.0;
      local_3f8[1] = 0.0;
      lVar4 = 0;
      do {
        local_3f8[lVar4] =
             *(float *)((long)&local_418 + lVar4 * 4) - *(float *)(local_438 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_448 = CONCAT44(local_3f8[0] * local_3e8[2] - local_3e8[0] * local_3f8[2],
                           local_3f8[2] * local_3e8[1] - local_3e8[2] * local_3f8[1]);
      local_440 = local_3e8[0] * local_3f8[1] - local_3f8[0] * local_3e8[1];
      fVar8 = 0.0;
      lVar4 = 0;
      do {
        fVar1 = *(float *)((long)&local_448 + lVar4 * 4);
        fVar8 = fVar8 + fVar1 * fVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      if (0.0 < fVar8) {
        lVar4 = 0;
        do {
          *(float *)((long)&local_448 + lVar4 * 4) =
               *(float *)((long)&local_448 + lVar4 * 4) / fVar8;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
      }
      cVar5 = (char)&local_3a0;
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      std::ostream::put(cVar5);
      puVar7 = puVar7 + 3;
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->n);
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  local_3a0 = _VTT;
  *(undefined8 *)(local_398 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_398);
  std::ios_base::~ios_base(local_2a8);
  return;
}

Assistant:

void Mesh::saveSTL(const char *name) const
{
  std::ofstream out;

  out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  out.open(name, std::ios_base::binary);

  // write header with camera definition

  std::ostringstream header;

  header << "campose=";
  gmath::Vector6d pose=gmath::getPose(getDefCameraR(), getDefCameraT());
  header << std::setprecision(5) << pose;

  while (header.tellp() < 80) header << ' ';

  out.write(header.str().c_str(), 80);

  // write number of triangles

  stlWriteUint32(out, static_cast<uint32_t>(n));

  unsigned int *tp=triangle;
  for (int i=0; i<n; i++)
  {
    // get vertices

    gmath::Vector3f v0=getVertex(tp[0]);
    gmath::Vector3f v1=getVertex(tp[1]);
    gmath::Vector3f v2=getVertex(tp[2]);

    // compute normal of triangle

    gmath::Vector3f vn=gmath::cross(v1-v0, v2-v0);
    float len=gmath::norm(vn);

    if (len > 0)
    {
      vn/=len;
    }

    // store normal

    stlWriteVector3f(out, vn);

    // store vertices

    stlWriteVector3f(out, v0);
    stlWriteVector3f(out, v1);
    stlWriteVector3f(out, v2);

    // store padding

    stlWriteUint16(out, 0);

    tp+=3;
  }

  out.close();
}